

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void explainSimpleCount(Parse *pParse,Table *pTab,Index *pIdx)

{
  char *pcVar1;
  bool bVar2;
  char *local_48;
  int bCover;
  Index *pIdx_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  if (pParse->explain == '\x02') {
    bVar2 = false;
    if ((pIdx != (Index *)0x0) && (bVar2 = true, (pTab->tabFlags & 0x20) != 0)) {
      bVar2 = (*(ushort *)&pIdx->field_0x63 & 3) != 2;
    }
    pcVar1 = "";
    if (bVar2) {
      pcVar1 = " USING COVERING INDEX ";
      local_48 = pIdx->zName;
    }
    else {
      local_48 = "";
    }
    sqlite3VdbeExplain(pParse,'\0',"SCAN TABLE %s%s%s",pTab->zName,pcVar1,local_48);
  }
  return;
}

Assistant:

static void explainSimpleCount(
  Parse *pParse,                  /* Parse context */
  Table *pTab,                    /* Table being queried */
  Index *pIdx                     /* Index used to optimize scan, or NULL */
){
  if( pParse->explain==2 ){
    int bCover = (pIdx!=0 && (HasRowid(pTab) || !IsPrimaryKeyIndex(pIdx)));
    sqlite3VdbeExplain(pParse, 0, "SCAN TABLE %s%s%s",
        pTab->zName,
        bCover ? " USING COVERING INDEX " : "",
        bCover ? pIdx->zName : ""
    );
  }
}